

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O3

double __thiscall
QuasispeciesEdgeCalculator::singleOverlap
          (QuasispeciesEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int strain1,
          int strain2,double MIN_OVERLAP,double cutoff)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  sp_counted_base *psVar3;
  double dVar4;
  pointer pcVar5;
  QuasispeciesEdgeCalculator *pQVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  ShortDnaSequence *pSVar13;
  vector<char,_std::allocator<char>_> *pvVar14;
  size_t sVar15;
  mapped_type_conflict *pmVar16;
  pointer pcVar17;
  ulong uVar18;
  _Base_ptr p_Var19;
  pointer pcVar20;
  int iVar21;
  int iVar22;
  _Base_ptr p_Var23;
  long lVar24;
  ulong uVar25;
  int s1;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *pmVar26;
  ulong uVar27;
  ulong pos;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  _Base_ptr local_1a8;
  int j_global;
  double local_190;
  int offset1;
  shared_count asStack_180 [2];
  ulong local_170;
  vector<char,_std::allocator<char>_> local_168;
  _Base_ptr local_150;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_148;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_140;
  vector<char,_std::allocator<char>_> local_138;
  QuasispeciesEdgeCalculator *local_120;
  double local_118;
  double local_110;
  ShortDnaSequence local_108;
  ShortDnaSequence local_c0;
  int offset2;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_70;
  _Base_ptr local_68;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_60;
  _Base_ptr local_58;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_50;
  _Base_ptr local_48;
  ulong local_40;
  int overlap;
  
  local_120 = this;
  local_110 = cutoff;
  ShortDnaSequence::ShortDnaSequence(&local_c0);
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ShortDnaSequence::ShortDnaSequence(&local_108);
  local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (strain1 == 2) {
    uVar9 = AlignmentRecord::getStart2(ap1);
    uVar10 = AlignmentRecord::getEnd2(ap1);
    pSVar13 = AlignmentRecord::getSequence2(ap1);
    peVar2 = (pSVar13->forward).px;
    psVar3 = (pSVar13->forward).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_c0.forward.px;
    asStack_180[0].pi_ = local_c0.forward.pn.pi_;
    local_c0.forward.px = peVar2;
    local_c0.forward.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    peVar2 = (pSVar13->forward_qualities).px;
    psVar3 = (pSVar13->forward_qualities).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_c0.forward_qualities.px;
    asStack_180[0].pi_ = local_c0.forward_qualities.pn.pi_;
    local_c0.forward_qualities.px = peVar2;
    local_c0.forward_qualities.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    peVar2 = (pSVar13->backward).px;
    psVar3 = (pSVar13->backward).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_c0.backward.px;
    asStack_180[0].pi_ = local_c0.backward.pn.pi_;
    local_c0.backward.px = peVar2;
    local_c0.backward.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    peVar2 = (pSVar13->backward_qualities).px;
    psVar3 = (pSVar13->backward_qualities).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_c0.backward_qualities.px;
    asStack_180[0].pi_ = local_c0.backward_qualities.pn.pi_;
    local_c0.backward_qualities.px = peVar2;
    local_c0.backward_qualities.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    pvVar14 = AlignmentRecord::getCigar2Unrolled(ap1);
    std::vector<char,_std::allocator<char>_>::operator=(&local_168,pvVar14);
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    if (strain1 == 1) {
      uVar9 = AlignmentRecord::getStart1(ap1);
      uVar10 = AlignmentRecord::getEnd1(ap1);
      pSVar13 = AlignmentRecord::getSequence1(ap1);
      peVar2 = (pSVar13->forward).px;
      psVar3 = (pSVar13->forward).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_c0.forward.px;
      asStack_180[0].pi_ = local_c0.forward.pn.pi_;
      local_c0.forward.px = peVar2;
      local_c0.forward.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      peVar2 = (pSVar13->forward_qualities).px;
      psVar3 = (pSVar13->forward_qualities).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_c0.forward_qualities.px;
      asStack_180[0].pi_ = local_c0.forward_qualities.pn.pi_;
      local_c0.forward_qualities.px = peVar2;
      local_c0.forward_qualities.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      peVar2 = (pSVar13->backward).px;
      psVar3 = (pSVar13->backward).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_c0.backward.px;
      asStack_180[0].pi_ = local_c0.backward.pn.pi_;
      local_c0.backward.px = peVar2;
      local_c0.backward.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      peVar2 = (pSVar13->backward_qualities).px;
      psVar3 = (pSVar13->backward_qualities).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_c0.backward_qualities.px;
      asStack_180[0].pi_ = local_c0.backward_qualities.pn.pi_;
      local_c0.backward_qualities.px = peVar2;
      local_c0.backward_qualities.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      pvVar14 = AlignmentRecord::getCigar1Unrolled(ap1);
      std::vector<char,_std::allocator<char>_>::operator=(&local_168,pvVar14);
    }
  }
  if (strain2 == 2) {
    uVar11 = AlignmentRecord::getStart2(ap2);
    uVar25 = (ulong)uVar11;
    uVar11 = AlignmentRecord::getEnd2(ap2);
    pSVar13 = AlignmentRecord::getSequence2(ap2);
    peVar2 = (pSVar13->forward).px;
    psVar3 = (pSVar13->forward).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_108.forward.px;
    asStack_180[0].pi_ = local_108.forward.pn.pi_;
    local_108.forward.px = peVar2;
    local_108.forward.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    peVar2 = (pSVar13->forward_qualities).px;
    psVar3 = (pSVar13->forward_qualities).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_108.forward_qualities.px;
    asStack_180[0].pi_ = local_108.forward_qualities.pn.pi_;
    local_108.forward_qualities.px = peVar2;
    local_108.forward_qualities.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    peVar2 = (pSVar13->backward).px;
    psVar3 = (pSVar13->backward).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_108.backward.px;
    asStack_180[0].pi_ = local_108.backward.pn.pi_;
    local_108.backward.px = peVar2;
    local_108.backward.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    peVar2 = (pSVar13->backward_qualities).px;
    psVar3 = (pSVar13->backward_qualities).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    _offset1 = local_108.backward_qualities.px;
    asStack_180[0].pi_ = local_108.backward_qualities.pn.pi_;
    local_108.backward_qualities.px = peVar2;
    local_108.backward_qualities.pn.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(asStack_180);
    pvVar14 = AlignmentRecord::getCigar2Unrolled(ap2);
    std::vector<char,_std::allocator<char>_>::operator=(&local_138,pvVar14);
  }
  else {
    uVar25 = 0;
    uVar11 = 0;
    if (strain2 == 1) {
      uVar11 = AlignmentRecord::getStart1(ap2);
      uVar25 = (ulong)uVar11;
      uVar11 = AlignmentRecord::getEnd1(ap2);
      pSVar13 = AlignmentRecord::getSequence1(ap2);
      peVar2 = (pSVar13->forward).px;
      psVar3 = (pSVar13->forward).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_108.forward.px;
      asStack_180[0].pi_ = local_108.forward.pn.pi_;
      local_108.forward.px = peVar2;
      local_108.forward.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      peVar2 = (pSVar13->forward_qualities).px;
      psVar3 = (pSVar13->forward_qualities).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_108.forward_qualities.px;
      asStack_180[0].pi_ = local_108.forward_qualities.pn.pi_;
      local_108.forward_qualities.px = peVar2;
      local_108.forward_qualities.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      peVar2 = (pSVar13->backward).px;
      psVar3 = (pSVar13->backward).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_108.backward.px;
      asStack_180[0].pi_ = local_108.backward.pn.pi_;
      local_108.backward.px = peVar2;
      local_108.backward.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      peVar2 = (pSVar13->backward_qualities).px;
      psVar3 = (pSVar13->backward_qualities).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        psVar3->use_count_ = psVar3->use_count_ + 1;
        UNLOCK();
      }
      _offset1 = local_108.backward_qualities.px;
      asStack_180[0].pi_ = local_108.backward_qualities.pn.pi_;
      local_108.backward_qualities.px = peVar2;
      local_108.backward_qualities.pn.pi_ = psVar3;
      boost::detail::shared_count::~shared_count(asStack_180);
      pvVar14 = AlignmentRecord::getCigar1Unrolled(ap2);
      std::vector<char,_std::allocator<char>_>::operator=(&local_138,pvVar14);
    }
  }
  if ((int)uVar25 < (int)uVar9) {
    std::swap<ShortDnaSequence>(&local_c0,&local_108);
    pcVar5 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar20 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pcVar17 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar17;
    local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar20;
    local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar5;
    uVar27 = uVar25;
    uVar25 = (ulong)uVar9;
    uVar9 = uVar11;
    uVar11 = uVar10;
  }
  else {
    uVar27 = (ulong)uVar9;
    uVar9 = uVar10;
  }
  _offset1 = (element_type *)((ulong)_offset1 & 0xffffffff00000000);
  offset2 = 0;
  overlap = 0;
  s1 = (int)uVar27;
  computeOffsets((QuasispeciesEdgeCalculator *)&offset2,s1,(int)uVar25,uVar9,uVar11,&offset1,
                 &offset2,&overlap);
  local_1a8 = (_Base_ptr)0x0;
  if (MIN_OVERLAP <= (double)overlap) {
    iVar22 = offset1;
    uVar27 = (ulong)offset1;
    sVar15 = ShortDnaSequence::size(&local_c0);
    if ((uVar27 < sVar15) &&
       (uVar27 = (ulong)offset2, sVar15 = ShortDnaSequence::size(&local_108), local_40 = uVar25,
       uVar27 < sVar15)) {
      uVar18 = (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      pos = 0;
      uVar27 = 0;
      uVar30 = 0;
      uVar25 = 0;
      while( true ) {
        do {
        } while ((ulong)((long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start) <= uVar25 || uVar18 <= uVar30);
        cVar7 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar30];
        if ((((cVar7 != 'H') && (cVar7 != 'S')) &&
            (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar25] != 'H')) &&
           (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar25] != 'S')) break;
        pos = pos + (cVar7 == 'S');
        lVar29 = uVar30 + (cVar7 == 'S');
        uVar27 = uVar27 + (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar25] == 'S');
        lVar24 = uVar25 + (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar25] == 'S');
        uVar30 = lVar29 + (ulong)(local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar29] == 'H');
        uVar25 = lVar24 + (ulong)(local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar24] == 'H');
      }
      local_118 = 0.0;
      local_170 = 0;
      if (iVar22 == 0) {
        iVar22 = 0;
        local_190 = 0.0;
      }
      else {
        pmVar26 = &local_120->SIMPSON_MAP;
        local_150 = &(local_120->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_148 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)(ulong)(uint)-iVar22;
        iVar21 = 0;
        local_190 = 0.0;
        iVar22 = 0;
        do {
          uVar31 = uVar30;
          uVar18 = (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          lVar24 = 0;
          while (uVar18 <= uVar31 + lVar24) {
            lVar24 = lVar24 + 1;
            if (iVar21 + (int)local_148 + (int)lVar24 == 0) {
              uVar30 = uVar31 + lVar24;
              goto LAB_00155c56;
            }
          }
          if (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24 + uVar31] == 'I') {
LAB_00155bfb:
            pos = pos + 1;
          }
          else if (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar24 + uVar31] == 'M') {
            if ((local_110 != 1.0) || (NAN(local_110))) {
              j_global = s1 + iVar22;
              p_Var19 = (local_120->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              p_Var23 = local_150;
              if (p_Var19 != (_Base_ptr)0x0 &&
                  (local_120->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                  local_150) {
                do {
                  if (j_global <= (int)p_Var19[1]._M_color) {
                    p_Var23 = p_Var19;
                  }
                  p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < j_global];
                } while (p_Var19 != (_Base_ptr)0x0);
                if ((p_Var23 != local_150) && ((int)p_Var23[1]._M_color <= j_global)) {
                  local_140 = pmVar26;
                  pmVar16 = std::
                            map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            ::at(pmVar26,&j_global);
                  dVar4 = log(*pmVar16);
                  local_190 = local_190 + dVar4;
                  pmVar26 = local_140;
                }
              }
            }
            iVar22 = iVar22 + 1;
            goto LAB_00155bfb;
          }
          iVar12 = iVar21 + (int)lVar24;
          iVar21 = iVar21 + (int)lVar24 + 1;
          uVar30 = uVar31 + lVar24 + 1;
        } while (iVar12 + (int)local_148 != -1);
        uVar18 = (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar30 = uVar31 + lVar24 + 1;
      }
LAB_00155c56:
      if (uVar30 < uVar18) {
        local_170 = 0;
        local_118 = 0.0;
        uVar18 = uVar25;
        uVar31 = uVar30;
        do {
          uVar25 = uVar18;
          uVar30 = uVar31;
          if (((((ulong)((long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start) <= uVar18) ||
               (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar31] == 'S')) ||
              (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18] == 'S')) ||
             ((sVar15 = ShortDnaSequence::size(&local_c0), sVar15 <= pos ||
              (sVar15 = ShortDnaSequence::size(&local_108), sVar15 <= uVar27)))) break;
          if ((local_110 == 1.0) && (!NAN(local_110))) {
            cVar7 = ShortDnaSequence::operator[](&local_c0,pos);
            cVar8 = ShortDnaSequence::operator[](&local_108,uVar27);
            if (cVar7 == cVar8) {
              pos = pos + 1;
              uVar25 = uVar18 + 1;
              uVar28 = uVar27 + 1;
              uVar30 = uVar31 + 1;
              goto LAB_00155d1c;
            }
LAB_001562f7:
            uVar32 = 0;
            uVar33 = 0;
            goto LAB_001562a3;
          }
          cVar7 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar31];
          cVar8 = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18];
          uVar28 = uVar27;
          if (cVar7 == cVar8) {
            if (cVar7 == 'D') {
              uVar30 = uVar31 + 1;
              uVar25 = uVar18 + 1;
            }
            else {
              if ((cVar7 != 'M') && (cVar7 != 'I')) goto LAB_00155fed;
              local_1a8 = (_Base_ptr)ShortDnaSequence::qualityCorrect(&local_c0,pos);
              local_148 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)ShortDnaSequence::qualityCorrect(&local_108,uVar27);
              cVar7 = ShortDnaSequence::operator[](&local_c0,pos);
              cVar8 = ShortDnaSequence::operator[](&local_108,uVar27);
              local_150 = (_Base_ptr)((1.0 - (double)local_1a8) / 3.0);
              local_48 = local_1a8;
              if (cVar7 != 'A') {
                local_48 = local_150;
              }
              local_140 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)((1.0 - (double)local_148) / 3.0);
              local_50 = local_148;
              if (cVar8 != 'A') {
                local_50 = local_140;
              }
              cVar7 = ShortDnaSequence::operator[](&local_c0,pos);
              cVar8 = ShortDnaSequence::operator[](&local_108,uVar27);
              local_58 = local_1a8;
              if (cVar7 != 'C') {
                local_58 = local_150;
              }
              local_60 = local_148;
              if (cVar8 != 'C') {
                local_60 = local_140;
              }
              cVar7 = ShortDnaSequence::operator[](&local_c0,pos);
              cVar8 = ShortDnaSequence::operator[](&local_108,uVar27);
              local_68 = local_1a8;
              if (cVar7 != 'G') {
                local_68 = local_150;
              }
              local_70 = local_148;
              if (cVar8 != 'G') {
                local_70 = local_140;
              }
              cVar7 = ShortDnaSequence::operator[](&local_c0,pos);
              cVar8 = ShortDnaSequence::operator[](&local_108,uVar27);
              if (cVar7 != 'T') {
                local_1a8 = local_150;
              }
              if (cVar8 != 'T') {
                local_148 = local_140;
              }
              dVar4 = log((double)local_68 * (double)local_70 +
                          (double)local_58 * (double)local_60 +
                          (double)local_48 * (double)local_50 + 0.0 +
                          (double)local_1a8 * (double)local_148);
              local_190 = local_190 + dVar4;
              local_118 = local_118 + 1.0;
              uVar30 = uVar31 + 1;
              pos = pos + 1;
              uVar25 = uVar18 + 1;
              uVar28 = uVar27 + 1;
              if (((ulong)((long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start) <= uVar30) ||
                 (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar30] != 'M')) goto LAB_00155d1c;
              iVar22 = iVar22 + 1;
LAB_0015601b:
              local_170 = (ulong)((int)local_170 + 1);
              uVar25 = uVar18 + 1;
              uVar28 = uVar27 + 1;
              uVar30 = uVar31 + 1;
            }
          }
          else {
LAB_00155fed:
            if (local_120->FRAMESHIFT_MERGE != true) goto LAB_001562f7;
            if (cVar8 == 'M') {
              if (cVar7 == 'I') {
                pos = pos + 1;
                uVar30 = uVar31 + 1;
              }
              else if (cVar7 == 'D') goto LAB_0015601b;
            }
            else {
              local_1a8 = (_Base_ptr)0x0;
              if (cVar7 != 'M') goto LAB_001562a8;
              if (cVar8 == 'I') {
                uVar25 = uVar18 + 1;
                uVar28 = uVar27 + 1;
              }
              else if (cVar8 == 'D') {
                uVar25 = uVar18 + 1;
                pos = pos + 1;
                iVar22 = iVar22 + 1;
                uVar30 = uVar31 + 1;
              }
            }
          }
LAB_00155d1c:
          uVar18 = uVar25;
          uVar27 = uVar28;
          uVar31 = uVar30;
        } while (uVar30 < (ulong)((long)local_168.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_168.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
      }
      uVar27 = local_40;
      pQVar6 = local_120;
      local_1a8 = (_Base_ptr)0x3ff0000000000000;
      if ((local_110 != 1.0) || (NAN(local_110))) {
        if ((uVar30 < (ulong)((long)local_168.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start)) &&
           (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar30] != 'S')) {
          pmVar26 = &local_120->SIMPSON_MAP;
          p_Var1 = &(local_120->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header;
          pcVar17 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar20 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if (pcVar17[uVar30] == 'M') {
              j_global = iVar22 + s1;
              p_Var19 = (pQVar6->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
              ;
              p_Var23 = &p_Var1->_M_header;
              if (p_Var19 != (_Base_ptr)0x0 &&
                  (_Rb_tree_header *)
                  (pQVar6->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                  p_Var1) {
                do {
                  if (j_global <= (int)*(size_t *)(p_Var19 + 1)) {
                    p_Var23 = p_Var19;
                  }
                  p_Var19 = (&p_Var19->_M_left)[(int)*(size_t *)(p_Var19 + 1) < j_global];
                } while (p_Var19 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var23 != p_Var1) &&
                   ((int)((_Rb_tree_header *)p_Var23)->_M_node_count <= j_global)) {
                  pmVar16 = std::
                            map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            ::at(pmVar26,&j_global);
                  dVar4 = log(*pmVar16);
                  local_190 = local_190 + dVar4;
                  pcVar17 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pcVar20 = local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
              }
              iVar22 = iVar22 + 1;
            }
            else if (pcVar17[uVar30] == 'S') break;
            uVar30 = uVar30 + 1;
          } while (uVar30 < (ulong)((long)pcVar20 - (long)pcVar17));
        }
        else if ((uVar25 < (ulong)((long)local_138.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_138.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start)) &&
                (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25] != 'S')) {
          pmVar26 = &local_120->SIMPSON_MAP;
          p_Var1 = &(local_120->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header;
          pcVar17 = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar20 = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if (pcVar17[uVar25] == 'M') {
              j_global = (int)local_170 + (int)uVar27;
              p_Var19 = (pQVar6->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
              ;
              p_Var23 = &p_Var1->_M_header;
              if (p_Var19 != (_Base_ptr)0x0 &&
                  (_Rb_tree_header *)
                  (pQVar6->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                  p_Var1) {
                do {
                  if (j_global <= (int)*(size_t *)(p_Var19 + 1)) {
                    p_Var23 = p_Var19;
                  }
                  p_Var19 = (&p_Var19->_M_left)[(int)*(size_t *)(p_Var19 + 1) < j_global];
                } while (p_Var19 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var23 != p_Var1) &&
                   ((int)((_Rb_tree_header *)p_Var23)->_M_node_count <= j_global)) {
                  pmVar16 = std::
                            map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            ::at(pmVar26,&j_global);
                  dVar4 = log(*pmVar16);
                  local_190 = local_190 + dVar4;
                  pcVar17 = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pcVar20 = local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
              }
              local_170 = (ulong)((int)local_170 + 1);
            }
            else if (pcVar17[uVar25] == 'S') break;
            uVar25 = uVar25 + 1;
          } while (uVar25 < (ulong)((long)pcVar20 - (long)pcVar17));
        }
        dVar4 = exp(local_190);
        dVar4 = pow(dVar4,1.0 / local_118);
        uVar32 = SUB84(dVar4,0);
        uVar33 = (undefined4)((ulong)dVar4 >> 0x20);
LAB_001562a3:
        local_1a8 = (_Base_ptr)CONCAT44(uVar33,uVar32);
      }
    }
  }
LAB_001562a8:
  if (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ShortDnaSequence::~ShortDnaSequence(&local_108);
  if (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ShortDnaSequence::~ShortDnaSequence(&local_c0);
  return (double)local_1a8;
}

Assistant:

double QuasispeciesEdgeCalculator::singleOverlap(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int strain1, int strain2, double MIN_OVERLAP, const double cutoff) const {
    int e1 = 0;
    int s1 = 0;
    ShortDnaSequence sequence1;
    vector<char> cigar1;

    int e2 = 0;
    int s2 = 0;
    ShortDnaSequence sequence2;
    vector<char> cigar2;

    if (strain1 == 1) {
        s1 = ap1.getStart1();
        e1 = ap1.getEnd1();
        sequence1 = ap1.getSequence1();
        cigar1 = ap1.getCigar1Unrolled();
    } else if (strain1 == 2) {
        s1 = ap1.getStart2();
        e1 = ap1.getEnd2();
        sequence1 = ap1.getSequence2();
        cigar1 = ap1.getCigar2Unrolled();
    }
    if (strain2 == 1) {
        s2 = ap2.getStart1();
        e2 = ap2.getEnd1();
        sequence2 = ap2.getSequence1();
        cigar2 = ap2.getCigar1Unrolled();
    } else if (strain2 == 2) {
        s2 = ap2.getStart2();
        e2 = ap2.getEnd2();
        sequence2 = ap2.getSequence2();
        cigar2 = ap2.getCigar2Unrolled();
    }

    if (s2 < s1) {
        std::swap(s1,s2);
        std::swap(e1,e2);
        std::swap(sequence1,sequence2);
        std::swap(cigar1,cigar2);
    }

    // ====
    // compute overlap
    int offset1 = 0;
    int offset2 = 0;
    int overlap = 0;
    computeOffsets(s1, s2, e1, e2, offset1, offset2, overlap);

    if (offset2 > 0) {
        //cerr << "offset 2: " << offset2 << endl;
    }
    //cerr << "offset 1: " << offset1 << endl;
    //cerr << "offset 2: " << offset2 << endl;
    //cerr << "single overlap: " << overlap << endl;
    if (overlap < MIN_OVERLAP) {
        return 0;
    }

    // ====
    //Offsets for the deletions and insertions that occured
    //upstream of the overlap. They cause index errors if not fixed.
    int offset_deletion1_ = 0;
    int offset_deletion2_ = 0;

    double overlap_probability = 0.0;
    char alphabet[] = {'A', 'C', 'G', 'T'};
    double hamming = 0;
    double total_size = 0;
    if (offset1 >= sequence1.size() || offset2 >= sequence2.size()) {
        return 0;
    }
    ////cerr << offset1 << " offset " << offset2 << endl;
    bool perfect = cutoff == 1.0;

    unsigned long j_seq = 0, j_seq2 = 0;
    unsigned long j_cigar = 0, j_cigar2 = 0;
    int j = 0, j2 = 0;
    for (;;) {
        if(j_cigar < cigar1.size() && j_cigar2 < cigar2.size()) {

            if (cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && cigar1[j_cigar] != 'H' && cigar2[j_cigar2] != 'H') break;
            if (cigar1[j_cigar] == 'S') { j_cigar++; j_seq++; }
            if (cigar2[j_cigar2] == 'S') { j_cigar2++; j_seq2++; }
            if (cigar1[j_cigar] == 'H') { j_cigar++; }
            if (cigar2[j_cigar2] == 'H') { j_cigar2++; }
        }
    }
    for (int j_prefix = 0;;) {
        if (j_prefix == offset1) break;
        if(j_cigar >= cigar1.size()) {
            int _ = 0;
            j_cigar++;
            j_prefix++;
            continue;
        }
        switch (cigar1[j_cigar]) {
            case 'M': 
                if (!perfect) {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                }
                j++;
            case 'I':
                j_seq++;
            default: break;
        }
        j_cigar++;
        j_prefix++;
    }
    for (;j_cigar<cigar1.size() && j_cigar2<cigar2.size() && cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && j_seq < sequence1.size() && j_seq2 < sequence2.size();) {
        //cerr << cigar1[j_cigar] << cigar2[j_cigar2] << "\t"; 
        if (perfect) {
            if (sequence1[j_seq] != sequence2[j_seq2]) return 0;
            else {
                j_cigar++;
                j_cigar2++;
                j_seq++;
                j_seq2++;
            }
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && (cigar1[j_cigar] == 'M' || cigar1[j_cigar] == 'I')) {

            //cerr << sequence1[j_seq] << ":" << sequence2[j_seq2];
            double q_x1 = sequence1.qualityCorrect(j_seq);
            // if (q_x1 < 0.001) {
            //     q_x1 = 0.001;
            // }
            double q_x2 = sequence2.qualityCorrect(j_seq2);
            // if (q_x2 < 0.001) {
            //     q_x2 = 0.001;
            // }
            //cerr << "\t" << q_x1 << ":" << q_x2 << "\t";
            double anti_q_x1 = (1.0 - q_x1) / 3.0;
            double anti_q_x2 = (1.0 - q_x2) / 3.0;
            assert(q_x1 <= 1 && q_x2 <= 1);
            double sum = 0.0;
            sum += ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2));
            overlap_probability += log(sum);
            //cerr << "\t" << overlap_probability;
            total_size++;

            //cerr << sum << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2)) << "\t";

            j_cigar++;
            j_cigar2++;
            j_seq++;
            j_seq2++;

            if (j_cigar < cigar1.size() && cigar1[j_cigar] == 'M') {
                j++;
                j2++;
            } 
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && cigar1[j_cigar] == 'D') {
            j_cigar++;
            j_cigar2++;
        }else if (this->FRAMESHIFT_MERGE) {
            if (cigar2[j_cigar2] == 'M') {
                switch(cigar1[j_cigar]) {
                    case 'D':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar++;
                        j_cigar2++;
                        j_seq2++;
                        j2++;
                        break;
                    case 'I':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar++;
                        j_seq++;
                        break;
                    default: break;
                }
            } else if (cigar1[j_cigar] == 'M') {
                switch(cigar2[j_cigar2]) {
                    case 'D':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar2++;
                        j_cigar++;
                        j_seq++;
                        j++;
                        break;
                    case 'I':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar2++;
                        j_seq2++;
                        break;
                }
            } else {
                //cerr << "DOES NOT MATCH" << endl;
                return 0;
            }
        } else {
            return 0;
        }
        //cerr << endl;
    }
    if (!perfect) {
        if (j_cigar < cigar1.size() && cigar1[j_cigar] != 'S') {
            for (;j_cigar<cigar1.size();) {
                if (cigar1[j_cigar] == 'S') break;
                if (cigar1[j_cigar] == 'M') {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j++;
                }
                j_cigar++;
            }
        } else if (j_cigar2 < cigar2.size() && cigar2[j_cigar2] != 'S') {
            for (;j_cigar2<cigar2.size();) {
                if (cigar2[j_cigar2] == 'S') break;
                if (cigar2[j_cigar2] == 'M') {
                    //if (j_cigar >= 26){
                    //    cerr << s2 << endl;
                    //    cerr << j2 << endl;
                    //    cerr << s2+j2 << endl;
                    //}
                    int j_global = s2+j2;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j2++;
                }
                j_cigar2++;
            }
        }
    }
    //cerr << pow(exp(overlap_probability),1.0/total_size) << endl;
    if (perfect) return 1;
    return pow(exp(overlap_probability),1.0/total_size);
}